

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDFacePtr __thiscall ON_SubDEdge::FacePtrFromFace(ON_SubDEdge *this,ON_SubDFace *f)

{
  ON_SubDFacePtr *pOVar1;
  uint efi;
  uint uVar2;
  
  if (f != (ON_SubDFace *)0x0) {
    pOVar1 = this->m_face2;
    for (uVar2 = 0; this->m_face_count != uVar2; uVar2 = uVar2 + 1) {
      if (uVar2 == 2) {
        pOVar1 = this->m_facex;
      }
      if (uVar2 == 2 && this->m_facex == (ON_SubDFacePtr *)0x0) {
        return (ON_SubDFacePtr)0;
      }
      if ((ON_SubDFace *)(pOVar1->m_ptr & 0xfffffffffffffff8) == f) {
        return (ON_SubDFacePtr)pOVar1->m_ptr;
      }
      pOVar1 = pOVar1 + 1;
    }
  }
  return (ON_SubDFacePtr)0;
}

Assistant:

const ON_SubDFacePtr ON_SubDEdge::FacePtrFromFace(
  const class ON_SubDFace* f
) const
{
  if (nullptr != f)
  {
    const ON_SubDFacePtr* fptr = m_face2;
    const unsigned int edge_face_count = m_face_count;
    for (unsigned int efi = 0; efi < edge_face_count; efi++, fptr++)
    {
      if (2 == efi)
      {
        fptr = m_facex;
        if (nullptr == fptr)
          break;
      }
      if (fptr->Face() == f)
        return *fptr;
    }
  }
  return ON_SubDFacePtr::Null;
}